

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_extract(wally_psbt *psbt,wally_tx **output)

{
  wally_tx *src;
  wally_psbt_input *pwVar1;
  wally_tx_input *pwVar2;
  uchar *src_00;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  wally_tx_witness_stack *stack;
  ulong uVar8;
  wally_tx *result;
  long local_40;
  ulong local_38;
  
  result = (wally_tx *)0x0;
  iVar4 = -2;
  if (((((output != (wally_tx **)0x0) && (*output = (wally_tx *)0x0, psbt != (wally_psbt *)0x0)) &&
       (src = psbt->tx, src != (wally_tx *)0x0)) &&
      ((psbt->num_inputs != 0 && (psbt->num_outputs != 0)))) &&
     ((src->num_inputs == psbt->num_inputs &&
      ((src->num_outputs == psbt->num_outputs && (iVar4 = tx_clone_alloc(src,&result), iVar4 == 0)))
      ))) {
    lVar6 = 0x40;
    lVar7 = 0x38;
    iVar4 = -2;
    for (uVar8 = 0; uVar8 < psbt->num_inputs; uVar8 = uVar8 + 1) {
      pwVar1 = psbt->inputs;
      pwVar2 = result->inputs;
      src_00 = *(uchar **)((long)pwVar1 + lVar6 + -0x10);
      iVar5 = iVar4;
      if (src_00 == (uchar *)0x0) {
        stack = *(wally_tx_witness_stack **)((long)&pwVar1->utxo + lVar6);
        if (stack == (wally_tx_witness_stack *)0x0) goto LAB_001076e8;
LAB_001076a4:
        if ((*(long *)(pwVar2->txhash + lVar7) != 0) ||
           (iVar5 = wally_tx_witness_stack_clone_alloc
                              (stack,(wally_tx_witness_stack **)(pwVar2->txhash + lVar7)),
           iVar5 != 0)) {
LAB_001076e8:
          wally_tx_free(result);
          return iVar5;
        }
      }
      else {
        if (*(long *)(pwVar2->txhash + lVar7 + -0x10) != 0) goto LAB_001076e8;
        local_40 = lVar7;
        local_38 = uVar8;
        _Var3 = clone_bytes((uchar **)(pwVar2->txhash + lVar7 + -0x10),src_00,
                            *(size_t *)((long)pwVar1 + lVar6 + -8));
        if (!_Var3) {
          iVar5 = -3;
          goto LAB_001076e8;
        }
        *(undefined8 *)(pwVar2->txhash + local_40 + -8) = *(undefined8 *)((long)pwVar1 + lVar6 + -8)
        ;
        stack = *(wally_tx_witness_stack **)((long)&pwVar1->utxo + lVar6);
        lVar7 = local_40;
        uVar8 = local_38;
        if (stack != (wally_tx_witness_stack *)0x0) goto LAB_001076a4;
      }
      lVar6 = lVar6 + 0x110;
      lVar7 = lVar7 + 0xd0;
    }
    *output = result;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int wally_psbt_extract(const struct wally_psbt *psbt, struct wally_tx **output)
{
    struct wally_tx *result = NULL;
    size_t i;
    int ret;

    TX_CHECK_OUTPUT;

    if (!psbt || !psbt->tx || !psbt->num_inputs || !psbt->num_outputs ||
        psbt->tx->num_inputs != psbt->num_inputs ||
        psbt->tx->num_outputs != psbt->num_outputs)
        return WALLY_EINVAL;

    if ((ret = tx_clone_alloc(psbt->tx, &result)) != WALLY_OK)
        return ret;

    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *tx_input = &result->inputs[i];

        if (!input->final_scriptsig && !input->final_witness) {
            ret = WALLY_EINVAL;
            break;
        }

        if (input->final_scriptsig) {
            if (tx_input->script) {
                /* Our global tx shouldn't have a scriptSig */
                ret = WALLY_EINVAL;
                break;
            }
            if (!clone_bytes(&tx_input->script,
                             input->final_scriptsig,
                             input->final_scriptsig_len)) {
                ret = WALLY_ENOMEM;
                break;
            }
            tx_input->script_len = input->final_scriptsig_len;
        }
        if (input->final_witness) {
            if (tx_input->witness) {
                /* Our global tx shouldn't have a witness */
                ret = WALLY_EINVAL;
                break;
            }
            ret = wally_tx_witness_stack_clone_alloc(input->final_witness,
                                                     &tx_input->witness);
            if (ret != WALLY_OK)
                break;
        }
    }

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);
    return ret;
}